

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O3

void __thiscall Text::Text(Text *this,u16string *content)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar2;
  pointer pcVar3;
  iterator __position;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  initializer_list<unsigned_int> __l;
  allocator_type local_39;
  uint local_38 [2];
  
  paVar1 = &(this->content).field_2;
  (this->content)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (content->_M_dataplus)._M_p;
  paVar2 = &content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&content->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->content).field_2 + 8) = uVar4;
  }
  else {
    (this->content)._M_dataplus._M_p = pcVar3;
    (this->content).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->content)._M_string_length = content->_M_string_length;
  (content->_M_dataplus)._M_p = (pointer)paVar2;
  content->_M_string_length = 0;
  (content->field_2)._M_local_buf[0] = L'\0';
  local_38[1] = 0;
  __l._M_len = 1;
  __l._M_array = local_38 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->line_offsets,__l,&local_39);
  uVar6 = (ulong)(uint)(this->content)._M_string_length;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      if ((this->content)._M_dataplus._M_p[uVar5] == L'\n') {
        local_38[0] = (int)uVar5 + 1;
        __position._M_current =
             (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->line_offsets,__position,local_38);
        }
        else {
          *__position._M_current = local_38[0];
          (this->line_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

Text::Text(u16string &&content) : content{move(content)}, line_offsets{0} {
  for (uint32_t offset = 0, size = this->content.size(); offset < size; offset++) {
    if (this->content[offset] == '\n') {
      line_offsets.push_back(offset + 1);
    }
  }
}